

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

image_u8 * __thiscall image_u8::crop(image_u8 *this,uint32_t new_width,uint32_t new_height)

{
  undefined8 uVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pcVar4;
  uint uVar5;
  uint uVar6;
  image_u8 local_38;
  
  if ((this->m_width != new_width) || (this->m_height != new_height)) {
    image_u8(&local_38,new_width,new_height);
    if (this->m_width < new_width) {
      new_width = this->m_width;
    }
    if (this->m_height < new_height) {
      new_height = this->m_height;
    }
    if (new_height != 0) {
      uVar5 = 0;
      do {
        if (new_width != 0) {
          uVar6 = 0;
          do {
            *(undefined4 *)
             local_38.m_pixels.super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>.
             _M_impl.super__Vector_impl_data._M_start[local_38.m_width * uVar5 + uVar6].m_c =
                 *(undefined4 *)
                  (this->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>
                  ._M_impl.super__Vector_impl_data._M_start[this->m_width * uVar5 + uVar6].m_c;
            uVar6 = uVar6 + 1;
          } while (new_width != uVar6);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != new_height);
    }
    uVar1._0_4_ = this->m_width;
    uVar1._4_4_ = this->m_height;
    this->m_width = local_38.m_width;
    this->m_height = local_38.m_height;
    pcVar2 = (this->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pcVar3 = (this->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pcVar4 = (this->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_38.m_pixels.super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl
         .super__Vector_impl_data._M_start;
    (this->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_38.m_pixels.super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl
         .super__Vector_impl_data._M_finish;
    (this->m_pixels).super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_38.m_pixels.super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage;
    if (pcVar2 != (pointer)0x0) {
      local_38.m_pixels.super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
      super__Vector_impl_data._M_start = pcVar2;
      local_38.m_pixels.super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar3;
      local_38.m_pixels.super__Vector_base<color_quad_u8,_std::allocator<color_quad_u8>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pcVar4;
      local_38._24_8_ = uVar1;
      operator_delete(pcVar2,(long)pcVar4 - (long)pcVar2);
    }
  }
  return this;
}

Assistant:

image_u8& crop(uint32_t new_width, uint32_t new_height)
	{
		if ((m_width == new_width) && (m_height == new_height))
			return *this;

		image_u8 new_image(new_width, new_height);

		const uint32_t w = std::min(m_width, new_width);
		const uint32_t h = std::min(m_height, new_height);

		for (uint32_t y = 0; y < h; y++)
			for (uint32_t x = 0; x < w; x++)
				new_image(x, y) = (*this)(x, y);

		return swap(new_image);
	}